

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlTextAddContent(xmlNodePtr text,xmlChar *content,int len)

{
  xmlChar *content_00;
  xmlChar *merged;
  int len_local;
  xmlChar *content_local;
  xmlNodePtr text_local;
  
  if (content == (xmlChar *)0x0) {
    text_local._4_4_ = 0;
  }
  else {
    content_00 = xmlStrncatNew(text->content,content,len);
    if (content_00 == (xmlChar *)0x0) {
      text_local._4_4_ = -1;
    }
    else {
      xmlTextSetContent(text,content_00);
      text_local._4_4_ = 0;
    }
  }
  return text_local._4_4_;
}

Assistant:

static int
xmlTextAddContent(xmlNodePtr text, const xmlChar *content, int len) {
    xmlChar *merged;

    if (content == NULL)
        return(0);

    merged = xmlStrncatNew(text->content, content, len);
    if (merged == NULL)
        return(-1);

    xmlTextSetContent(text, merged);
    return(0);
}